

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O0

RealType * __thiscall OpenMD::DataStorage::getArrayPointer(DataStorage *this,int whichArray)

{
  int in_ESI;
  DataStorage *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  if (in_ESI == 1) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          *)0x1fffcf);
  }
  else if (in_ESI == 2) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          *)0x1fffea);
  }
  else if (in_ESI == 4) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          *)0x200005);
  }
  else if (in_ESI == 8) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                          *)0x200020);
  }
  else if (in_ESI == 0x10) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          *)0x20003b);
  }
  else if (in_ESI == 0x20) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          *)0x200056);
  }
  else if (in_ESI == 0x40) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<double,_std::allocator<double>_> *)0x200074);
  }
  else if (in_ESI == 0x80) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<double,_std::allocator<double>_> *)0x200092);
  }
  else if (in_ESI == 0x100) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<double,_std::allocator<double>_> *)0x2000b0);
  }
  else if (in_ESI == 0x200) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<double,_std::allocator<double>_> *)0x2000ce);
  }
  else if (in_ESI == 0x400) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          *)0x2000ec);
  }
  else if (in_ESI == 0x800) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                          *)0x20010a);
  }
  else if (in_ESI == 0x1000) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          *)0x200128);
  }
  else if (in_ESI == 0x2000) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<double,_std::allocator<double>_> *)0x200146);
  }
  else if (in_ESI == 0x4000) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<double,_std::allocator<double>_> *)0x200161);
  }
  else if (in_ESI == 0x8000) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<double,_std::allocator<double>_> *)0x20017c);
  }
  else if (in_ESI == 0x10000) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<double,_std::allocator<double>_> *)0x200197);
  }
  else if (in_ESI == 0x20000) {
    local_8 = internalGetArrayPointer
                        (in_stack_ffffffffffffffd8,
                         (vector<double,_std::allocator<double>_> *)0x2001b2);
  }
  else {
    local_8 = (RealType *)0x0;
  }
  return local_8;
}

Assistant:

RealType* DataStorage::getArrayPointer(int whichArray) {
    switch (whichArray) {
    case dslPosition:
      return internalGetArrayPointer(position);

    case dslVelocity:
      return internalGetArrayPointer(velocity);

    case dslForce:
      return internalGetArrayPointer(force);

    case dslAmat:
      return internalGetArrayPointer(aMat);

    case dslAngularMomentum:
      return internalGetArrayPointer(angularMomentum);

    case dslTorque:
      return internalGetArrayPointer(torque);

    case dslParticlePot:
      return internalGetArrayPointer(particlePot);

    case dslDensity:
      return internalGetArrayPointer(density);

    case dslFunctional:
      return internalGetArrayPointer(functional);

    case dslFunctionalDerivative:
      return internalGetArrayPointer(functionalDerivative);

    case dslDipole:
      return internalGetArrayPointer(dipole);

    case dslQuadrupole:
      return internalGetArrayPointer(quadrupole);

    case dslElectricField:
      return internalGetArrayPointer(electricField);

    case dslSkippedCharge:
      return internalGetArrayPointer(skippedCharge);

    case dslFlucQPosition:
      return internalGetArrayPointer(flucQPos);

    case dslFlucQVelocity:
      return internalGetArrayPointer(flucQVel);

    case dslFlucQForce:
      return internalGetArrayPointer(flucQFrc);

    case dslSitePotential:
      return internalGetArrayPointer(sitePotential);

    default:
      // error message
      return NULL;
    }
  }